

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall FIX::Dictionary::Dictionary(Dictionary *this,string *name)

{
  string *name_local;
  Dictionary *this_local;
  
  this->_vptr_Dictionary = (_func_int **)&PTR__Dictionary_0032f3a0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_data);
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

Dictionary(const std::string &name)
      : m_name(name) {}